

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disassemble.cpp
# Opt level: O0

void __thiscall
spvtools::disassemble::InstructionDisassembler::EmitHeaderVersion
          (InstructionDisassembler *this,uint32_t version)

{
  ostream *poVar1;
  uint32_t version_local;
  InstructionDisassembler *this_local;
  
  poVar1 = std::operator<<(this->stream_,"; Version: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,version >> 0x10 & 0xff);
  poVar1 = std::operator<<(poVar1,".");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,version >> 8 & 0xff);
  std::operator<<(poVar1,"\n");
  return;
}

Assistant:

void InstructionDisassembler::EmitHeaderVersion(uint32_t version) {
  stream_ << "; Version: " << SPV_SPIRV_VERSION_MAJOR_PART(version) << "."
          << SPV_SPIRV_VERSION_MINOR_PART(version) << "\n";
}